

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualified_name.cpp
# Opt level: O0

void __thiscall
duckdb::QualifiedColumnName::QualifiedColumnName
          (QualifiedColumnName *this,BindingAlias *alias,string *column_p)

{
  string *psVar1;
  string *in_RDX;
  BindingAlias *in_RSI;
  string *in_RDI;
  BindingAlias *in_stack_ffffffffffffffe0;
  
  psVar1 = BindingAlias::GetCatalog_abi_cxx11_(in_RSI);
  ::std::__cxx11::string::string(in_RDI,(string *)psVar1);
  psVar1 = BindingAlias::GetSchema_abi_cxx11_(in_RSI);
  ::std::__cxx11::string::string(in_RDI + 0x20,(string *)psVar1);
  psVar1 = BindingAlias::GetAlias_abi_cxx11_(in_stack_ffffffffffffffe0);
  ::std::__cxx11::string::string(in_RDI + 0x40,(string *)psVar1);
  ::std::__cxx11::string::string(in_RDI + 0x60,in_RDX);
  return;
}

Assistant:

QualifiedColumnName::QualifiedColumnName(const BindingAlias &alias, string column_p)
    : catalog(alias.GetCatalog()), schema(alias.GetSchema()), table(alias.GetAlias()), column(std::move(column_p)) {
}